

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

wrapper<std::shared_ptr<complex2>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_complex2,_std::shared_ptr<complex2>_&>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int_const&,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
::
create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,std::shared_ptr<complex2>,boost::ext::di::v1_3_0::no_name>
          (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_const_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
           *this)

{
  shared<boost::ext::di::v1_3_0::scopes::singleton,_complex2,_std::shared_ptr<complex2>_&> sVar1;
  provider<boost::ext::di::v1_3_0::aux::pair<complex2,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_fwd<complex2>,_boost::ext::di::v1_3_0::core::any_type_fwd<complex2>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_const_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
  *in_RDI;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_complex2,_complex2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_complex2,_complex2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_const_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  *in_stack_ffffffffffffffd0;
  scope<complex2,_complex2> local_19;
  scope<complex2,_complex2> *local_18;
  
  binder::
  resolve<std::shared_ptr<complex2>,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,complex2,complex2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int_const&,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
            (in_stack_ffffffffffffffd0);
  local_18 = &local_19;
  sVar1 = scopes::deduce::scope<complex2,complex2>::
          create<std::shared_ptr<complex2>,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<complex2,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_fwd<complex2>,boost::ext::di::v1_3_0::core::any_type_fwd<complex2>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int_const&,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,int,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>>
                    (local_18,in_RDI);
  return (wrapper<std::shared_ptr<complex2>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_complex2,_std::shared_ptr<complex2>_&>_>
          )(shared<boost::ext::di::v1_3_0::scopes::singleton,_complex2,_std::shared_ptr<complex2>_&>
           )sVar1.object;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }